

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void util_tests::test_ParseUInt8_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestOpts opts;
  unit_test_log_t *puVar3;
  ios_base *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  test_ParseUInt8 t;
  undefined8 in_stack_fffffffffffff938;
  undefined8 in_stack_fffffffffffff940;
  pointer in_stack_fffffffffffff948;
  undefined8 in_stack_fffffffffffff950;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  undefined1 local_628 [112];
  ios_base local_5b8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  undefined1 local_488 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310 [21];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_630 = "";
  memset((ostringstream *)local_488,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
  local_310[0]._M_string_length = 0;
  local_310[0].field_2._M_local_buf[0] = '\0';
  local_628[0] = 0x22;
  local_310[0]._M_dataplus._M_p = (pointer)&local_310[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,local_628,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"test_ParseUInt8",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_310,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628);
  if ((undefined1 *)local_628._0_8_ != local_628 + 0x10) {
    operator_delete((void *)local_628._0_8_,local_628._16_8_ + 1);
  }
  local_648 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310[0]._M_dataplus._M_p;
  local_640 = local_310[0]._M_dataplus._M_p + local_310[0]._M_string_length;
  file.m_end = (iterator)0x369;
  file.m_begin = (iterator)&local_638;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_648,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310[0]._M_dataplus._M_p != &local_310[0].field_2) {
    operator_delete(local_310[0]._M_dataplus._M_p,
                    CONCAT71(local_310[0].field_2._M_allocated_capacity._1_7_,
                             local_310[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
  std::ios_base::~ios_base((ios_base *)(local_488 + 0x70));
  local_628._0_8_ = (pointer)0x0;
  local_628._8_8_ = 0;
  local_628._16_8_ = 0;
  local_628._24_4_ = 0x1010101;
  local_628[0x1c] = '\0';
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff940;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff938;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff948;
  opts.coins_db_in_memory = (bool)(char)in_stack_fffffffffffff950;
  opts.block_tree_db_in_memory = (bool)(char)((ulong)in_stack_fffffffffffff950 >> 8);
  opts.setup_net = (bool)(char)((ulong)in_stack_fffffffffffff950 >> 0x10);
  opts.setup_validation_interface = (bool)(char)((ulong)in_stack_fffffffffffff950 >> 0x18);
  opts.min_validation_cache = (bool)(char)((ulong)in_stack_fffffffffffff950 >> 0x20);
  opts._29_3_ = (int3)((ulong)in_stack_fffffffffffff950 >> 0x28);
  BasicTestingSetup::BasicTestingSetup((BasicTestingSetup *)local_488,MAIN,opts);
  if ((pointer)local_628._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_628._0_8_,local_628._16_8_ - local_628._0_8_);
  }
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_658 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_650 = "";
  memset((ostringstream *)local_628,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
  paVar1 = &local_4b0.field_2;
  local_4b0._M_string_length = 0;
  local_4b0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4b0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,"test_ParseUInt8",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4b0,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_668 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0._M_dataplus._M_p;
  local_660 = local_4b0._M_dataplus._M_p + local_4b0._M_string_length;
  file_00.m_end = (iterator)0x369;
  file_00.m_begin = (iterator)&local_658;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_668,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4b0._M_dataplus._M_p,
                    CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                             local_4b0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
  std::ios_base::~ios_base(local_5b8);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_670 = "";
  memset((ostringstream *)local_628,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
  local_4b0._M_string_length = 0;
  local_4b0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4b0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,"test_ParseUInt8",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4b0,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_688 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0._M_dataplus._M_p;
  local_680 = local_4b0._M_dataplus._M_p + local_4b0._M_string_length;
  file_01.m_end = (iterator)0x369;
  file_01.m_begin = (iterator)&local_678;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_688,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4b0._M_dataplus._M_p,
                    CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                             local_4b0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
  this = local_5b8;
  std::ios_base::~ios_base(this);
  test_ParseUInt8::test_method((test_ParseUInt8 *)this);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_690 = "";
  memset((ostringstream *)local_628,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
  local_4b0._M_string_length = 0;
  local_4b0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4b0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,"test_ParseUInt8",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_628,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4b0,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0._M_dataplus._M_p;
  local_6a0 = local_4b0._M_dataplus._M_p + local_4b0._M_string_length;
  file_02.m_end = (iterator)0x369;
  file_02.m_begin = (iterator)&local_698;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_6a8,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4b0._M_dataplus._M_p,
                    CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                             local_4b0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
  std::ios_base::~ios_base(local_5b8);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  memset((ostringstream *)local_628,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
  local_4b0._M_string_length = 0;
  local_4b0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4b0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,"test_ParseUInt8",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_628,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4b0,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  file_03.m_end = (iterator)0x369;
  file_03.m_begin = &stack0xfffffffffffff948;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (puVar3,file_03,(size_t)&stack0xfffffffffffff938,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4b0._M_dataplus._M_p,
                    CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                             local_4b0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
  std::ios_base::~ios_base(local_5b8);
  BasicTestingSetup::~BasicTestingSetup((BasicTestingSetup *)local_488);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ParseUInt8)
{
    uint8_t n;
    // Valid values
    BOOST_CHECK(ParseUInt8("255", nullptr));
    BOOST_CHECK(ParseUInt8("0", &n) && n == 0);
    BOOST_CHECK(ParseUInt8("255", &n) && n == 255);
    BOOST_CHECK(ParseUInt8("0255", &n) && n == 255); // no octal
    BOOST_CHECK(ParseUInt8("255", &n) && n == static_cast<uint8_t>(255));
    BOOST_CHECK(ParseUInt8("+255", &n) && n == 255);
    BOOST_CHECK(ParseUInt8("00000000000000000012", &n) && n == 12);
    BOOST_CHECK(ParseUInt8("00000000000000000000", &n) && n == 0);
    // Invalid values
    BOOST_CHECK(!ParseUInt8("-00000000000000000000", &n));
    BOOST_CHECK(!ParseUInt8("", &n));
    BOOST_CHECK(!ParseUInt8(" 1", &n)); // no padding inside
    BOOST_CHECK(!ParseUInt8(" -1", &n));
    BOOST_CHECK(!ParseUInt8("++1", &n));
    BOOST_CHECK(!ParseUInt8("+-1", &n));
    BOOST_CHECK(!ParseUInt8("-+1", &n));
    BOOST_CHECK(!ParseUInt8("--1", &n));
    BOOST_CHECK(!ParseUInt8("-1", &n));
    BOOST_CHECK(!ParseUInt8("1 ", &n));
    BOOST_CHECK(!ParseUInt8("1a", &n));
    BOOST_CHECK(!ParseUInt8("aap", &n));
    BOOST_CHECK(!ParseUInt8("0x1", &n)); // no hex
    BOOST_CHECK(!ParseUInt8(STRING_WITH_EMBEDDED_NULL_CHAR, &n));
    // Overflow and underflow
    BOOST_CHECK(!ParseUInt8("-255", &n));
    BOOST_CHECK(!ParseUInt8("256", &n));
    BOOST_CHECK(!ParseUInt8("-123", &n));
    BOOST_CHECK(!ParseUInt8("-123", nullptr));
    BOOST_CHECK(!ParseUInt8("256", nullptr));
}